

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifestuff.cpp
# Opt level: O1

int AF_A_ItBurnsItBurns(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  APlayerPawn *ent;
  undefined8 *puVar2;
  player_t *ppVar3;
  PClass *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined8 uVar6;
  PClass *pPVar7;
  FState *state;
  char *__assertion;
  bool bVar8;
  FName local_30;
  FSoundID local_2c;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005d710c;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    ent = (APlayerPawn *)(param->field_0).field_1.a;
    if (ent != (APlayerPawn *)0x0) {
      if ((ent->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(ent->super_AActor).super_DThinker.super_DObject._vptr_DObject)(ent);
        (ent->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar7 = (ent->super_AActor).super_DThinker.super_DObject.Class;
      bVar8 = pPVar7 != (PClass *)0x0;
      if (pPVar7 != pPVar4 && bVar8) {
        do {
          pPVar7 = pPVar7->ParentClass;
          bVar8 = pPVar7 != (PClass *)0x0;
          if (pPVar7 == pPVar4) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if (!bVar8) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005d710c;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005d70e1;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar6 = (**(code **)*puVar2)(puVar2);
          puVar2[1] = uVar6;
        }
        pPVar7 = (PClass *)puVar2[1];
        bVar8 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar4 && bVar8) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar8 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar4) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar8) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005d710c;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      local_2c.ID = S_FindSound("human/imonfire");
      S_Sound((AActor *)ent,2,&local_2c,1.0,1.0);
      ppVar3 = (ent->super_AActor).player;
      if ((ppVar3 != (player_t *)0x0) && (ppVar3->mo == ent)) {
        local_30.Index = FName::NameManager::FindName(&FName::NameData,"FireHands",false);
        state = AActor::FindState((AActor *)ent,&local_30);
        P_SetPsprite(ppVar3,PSP_STRIFEHANDS,state,false);
        ppVar3 = (ent->super_AActor).player;
        ppVar3->ReadyWeapon = (AWeapon *)0x0;
        ppVar3->PendingWeapon = (AWeapon *)0xffffffffffffffff;
        ppVar3->playerstate = '\0';
        ppVar3->extralight = 3;
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005d70e1:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005d710c:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifestuff.cpp"
                ,0x15d,"int AF_A_ItBurnsItBurns(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ItBurnsItBurns)
{
	PARAM_ACTION_PROLOGUE;

	S_Sound (self, CHAN_VOICE, "human/imonfire", 1, ATTN_NORM);

	if (self->player != nullptr && self->player->mo == self)
	{
		P_SetPsprite(self->player, PSP_STRIFEHANDS, self->FindState("FireHands"));

		self->player->ReadyWeapon = nullptr;
		self->player->PendingWeapon = WP_NOCHANGE;
		self->player->playerstate = PST_LIVE;
		self->player->extralight = 3;
	}
	return 0;
}